

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O1

bool OpenCLEnum::compareDevice(Device *dev1,Device *dev2)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((string *)&dev1->name);
  if (iVar2 < 1) {
    iVar2 = std::__cxx11::string::compare((string *)&dev1->name);
    if (iVar2 < 0) {
      bVar1 = true;
    }
    else {
      bVar1 = dev1->id <= dev2->id;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OpenCLEnum::compareDevice(const Device &dev1, const Device &dev2)
{
	if (dev1.name	> dev2.name)	return false;
	if (dev1.name	< dev2.name)	return true;
	if (dev1.id		> dev2.id)		return false;
	return true;
}